

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_asd::Frame<short,_asd::container::vec>_>
::load(list_caster<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_asd::Frame<short,_asd::container::vec>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  template_cast_op_type<typename_std::add_rvalue_reference<Frame<short>_&&>::type> __x;
  sequence_iterator sVar2;
  sequence_slow_readwrite sVar3;
  handle local_d0;
  PyObject *local_c8;
  undefined1 local_c0 [8];
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence local_48;
  sequence s;
  bool convert_local;
  list_caster<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_asd::Frame<short,_asd::container::vec>_>
  *this_local;
  handle src_local;
  
  bVar1 = isinstance<pybind11::sequence,_0>(src);
  if (((!bVar1) || (bVar1 = isinstance<pybind11::bytes,_0>(src), bVar1)) ||
     (s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr,
     bVar1 = isinstance<pybind11::str,_0>(src), bVar1)) {
    src_local.m_ptr._7_1_ = 0;
  }
  else {
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_48,src);
    std::
    vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>
    ::clear(&this->value);
    reserve_maybe<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_0>
              (this,&local_48,&this->value);
    sVar2 = sequence::begin(&local_48);
    __end3.super_sequence_slow_readwrite.index =
         (ssize_t)sVar2.super_sequence_slow_readwrite.obj.m_ptr;
    sVar3 = (sequence_slow_readwrite)sequence::end(&local_48);
    while( true ) {
      __end3.super_sequence_slow_readwrite.obj.m_ptr = (PyObject *)sVar3.index;
      it.cache.super_handle.m_ptr = sVar3.obj.m_ptr;
      bVar1 = detail::operator!=((It *)&__end3.super_sequence_slow_readwrite.index,(It *)&it.cache);
      if (!bVar1) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((reference *)
                 &conv.super_type_caster_base<asd::Frame<short,_asd::container::vec>_>.
                  super_type_caster_generic.value,
                 (generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      type_caster<asd::Frame<short,_asd::container::vec>,_void>::type_caster
                ((type_caster<asd::Frame<short,_asd::container::vec>,_void> *)local_c0);
      accessor::operator_cast_to_object((accessor *)&local_d0);
      local_c8 = local_d0.m_ptr;
      bVar1 = type_caster_generic::load((type_caster_generic *)local_c0,local_d0,convert);
      object::~object((object *)&local_d0);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        src_local.m_ptr._7_1_ = 0;
      }
      else {
        __x = cast_op<asd::Frame<short,asd::container::vec>&&>
                        ((make_caster<asd::Frame<short>_&&> *)local_c0);
        std::
        vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>
        ::push_back(&this->value,__x);
      }
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 &conv.super_type_caster_base<asd::Frame<short,_asd::container::vec>_>.
                  super_type_caster_generic.value);
      if (bVar1) goto LAB_001e581a;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      sVar3.index = (ssize_t)__end3.super_sequence_slow_readwrite.obj.m_ptr;
      sVar3.obj = it.cache.super_handle.m_ptr;
    }
    src_local.m_ptr._7_1_ = 1;
LAB_001e581a:
    sequence::~sequence(&local_48);
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src)) {
            return false;
        }
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert)) {
                return false;
            }
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }